

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_context.h
# Opt level: O3

bool __thiscall
Clasp::ShortImplicationsGraph::forEach<Clasp::ShortImplicationsGraph::ReverseArc>
          (ShortImplicationsGraph *this,Literal p,ReverseArc *op)

{
  pointer pIVar1;
  Literal x;
  pointer pIVar2;
  long lVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  Literal *pLVar10;
  __pointer_type pBVar11;
  
  uVar6 = p.rep_ >> 1;
  pIVar2 = (this->graph_).ebo_.buf;
  pIVar1 = pIVar2 + uVar6;
  uVar5 = pIVar2[uVar6].super_ImpListBase.super_type.
          super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.left_;
  uVar8 = pIVar2[uVar6].super_ImpListBase.super_type.
          super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.right_;
  if ((uVar5 == 0) &&
     (uVar8 == (*(uint *)&pIVar2[uVar6].super_ImpListBase.super_type.
                          super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>
                          .field_0x8 & 0x7fffffff))) {
    if ((pIVar1->learnt)._M_b._M_p == (__pointer_type)0x0) {
      return true;
    }
    uVar5 = (pIVar1->super_ImpListBase).super_type.
            super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.left_;
    uVar8 = (pIVar1->super_ImpListBase).super_type.
            super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.right_;
  }
  lVar3 = (long)(pIVar1->super_ImpListBase).super_type.
                super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.
                buf_;
  lVar7 = lVar3;
  if (uVar5 != 0) {
    uVar9 = 0;
    do {
      bVar4 = ReverseArc::unary(op,p,(Literal)*(uint32 *)(lVar3 + uVar9));
      if (!bVar4) {
        return false;
      }
      uVar9 = uVar9 + 4;
    } while (uVar5 != uVar9);
    lVar7 = (long)(pIVar1->super_ImpListBase).super_type.
                  super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.
                  buf_;
  }
  lVar7 = (ulong)(*(uint *)&(pIVar1->super_ImpListBase).super_type.
                            super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>
                            .field_0x8 & 0x7fffffff) + lVar7;
  do {
    if (lVar7 == lVar3 + (ulong)uVar8) {
      pBVar11 = (pIVar1->learnt)._M_b._M_p;
      if (pBVar11 == (__pointer_type)0x0) {
        return true;
      }
      do {
        uVar5 = (pBVar11->size_lock).super___atomic_base<unsigned_int>._M_i;
        if (1 < uVar5) {
          pLVar10 = pBVar11->data;
          do {
            x.rep_ = pLVar10->rep_;
            if ((x.rep_ & 1) == 0) {
              bVar4 = ReverseArc::binary(op,(Literal)(p.rep_ | 1),x,(Literal)pLVar10[1].rep_);
              if (!bVar4) {
                return false;
              }
              pLVar10 = pLVar10 + 2;
            }
            else {
              bVar4 = ReverseArc::unary(op,(Literal)(p.rep_ | 1),x);
              if (!bVar4) {
                return false;
              }
              pLVar10 = pLVar10 + 1;
            }
          } while (pLVar10 != pBVar11->data + (uVar5 >> 1));
        }
        pBVar11 = (pBVar11->next)._M_b._M_p;
      } while (pBVar11 != (__pointer_type)0x0);
      return true;
    }
    bVar4 = ReverseArc::binary(op,p,(Literal)*(uint32 *)(lVar7 + -8),
                               (Literal)*(uint32 *)(lVar7 + -4));
    lVar7 = lVar7 + -8;
  } while (bVar4);
  return false;
}

Assistant:

bool forEach(Literal p, const OP& op) const {
		const ImplicationList& x = graph_[p.id()];
		if (x.empty()) return true;
		ImplicationList::const_right_iterator rEnd = x.right_end(); // prefetch
		for (ImplicationList::const_left_iterator it = x.left_begin(), end = x.left_end(); it != end; ++it) {
			if (!op.unary(p, *it)) { return false; }
		}
		for (ImplicationList::const_right_iterator it = x.right_begin(); it != rEnd; ++it) {
			if (!op.binary(p, it->first, it->second)) { return false; }
		}
#if CLASP_HAS_THREADS
		for (Block* b = (x).learnt; b ; b = b->next) {
			p.flag(); bool r = true;
			for (Block::const_iterator imp = b->begin(), endOf = b->end(); imp != endOf; ) {
				if (!imp->flagged()) { r = op.binary(p, imp[0], imp[1]); imp += 2; }
				else                 { r = op.unary(p, imp[0]);          imp += 1; }
				if (!r)              { return false; }
			}
		}
#endif
		return true;
	}